

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcurrentQueue.h
# Opt level: O0

bool __thiscall
moodycamel::ConcurrentQueue<CSP_Event,moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducer::
insert_block_index_entry<(moodycamel::ConcurrentQueue<CSP_Event,moodycamel::ConcurrentQueueDefaultTraits>::AllocationMode)0>
          (ImplicitProducer *this,BlockIndexEntry **idxEntry,index_t blockStartIndex)

{
  _func_int **pp_Var1;
  bool bVar2;
  __pointer_type pBVar3;
  ulong uVar4;
  __pointer_type pBVar5;
  _func_int *in_RDX;
  ImplicitProducer *in_RSI;
  unsigned_long newTail;
  __pointer_type localBlockIndex;
  memory_order __b_6;
  memory_order __b_5;
  memory_order __b_3;
  memory_order __b_2;
  memory_order __b_4;
  memory_order __b_1;
  memory_order __b;
  undefined8 in_stack_fffffffffffffe90;
  memory_order __m;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  bool local_c9;
  
  __m = (memory_order)((ulong)in_stack_fffffffffffffe90 >> 0x20);
  pBVar3 = std::
           atomic<moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducer::BlockIndexHeader_*>
           ::load((atomic<moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducer::BlockIndexHeader_*>
                   *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),__m);
  if (pBVar3 == (__pointer_type)0x0) {
    local_c9 = false;
  }
  else {
    std::operator&(memory_order_relaxed,__memory_order_mask);
    uVar4 = (pBVar3->tail).super___atomic_base<unsigned_long>._M_i + 1 & pBVar3->capacity - 1;
    (in_RSI->super_ProducerBase)._vptr_ProducerBase = (_func_int **)pBVar3->index[uVar4];
    pp_Var1 = (in_RSI->super_ProducerBase)._vptr_ProducerBase;
    std::operator&(memory_order_relaxed,__memory_order_mask);
    if ((*pp_Var1 == (_func_int *)0x1) ||
       (pBVar5 = std::
                 atomic<moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::Block_*>
                 ::load((atomic<moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::Block_*>
                         *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),__m),
       pBVar5 == (__pointer_type)0x0)) {
      pp_Var1 = (in_RSI->super_ProducerBase)._vptr_ProducerBase;
      std::operator&(memory_order_relaxed,__memory_order_mask);
      *pp_Var1 = in_RDX;
      std::operator&(memory_order_release,__memory_order_mask);
      (pBVar3->tail).super___atomic_base<unsigned_long>._M_i = uVar4;
      local_c9 = true;
    }
    else {
      bVar2 = ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducer
              ::new_block_index(in_RSI);
      if (bVar2) {
        pBVar3 = std::
                 atomic<moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducer::BlockIndexHeader_*>
                 ::load((atomic<moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducer::BlockIndexHeader_*>
                         *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),__m);
        std::operator&(memory_order_relaxed,__memory_order_mask);
        uVar4 = (pBVar3->tail).super___atomic_base<unsigned_long>._M_i + 1 & pBVar3->capacity - 1;
        (in_RSI->super_ProducerBase)._vptr_ProducerBase = (_func_int **)pBVar3->index[uVar4];
        pp_Var1 = (in_RSI->super_ProducerBase)._vptr_ProducerBase;
        std::operator&(memory_order_relaxed,__memory_order_mask);
        *pp_Var1 = in_RDX;
        std::operator&(memory_order_release,__memory_order_mask);
        (pBVar3->tail).super___atomic_base<unsigned_long>._M_i = uVar4;
        local_c9 = true;
      }
      else {
        local_c9 = false;
      }
    }
  }
  return local_c9;
}

Assistant:

inline bool insert_block_index_entry(BlockIndexEntry*& idxEntry, index_t blockStartIndex)
        {
            auto localBlockIndex = blockIndex.load(std::memory_order_relaxed);      // We're the only writer thread, relaxed is OK
            if (localBlockIndex == nullptr) {
                return false;  // this can happen if new_block_index failed in the constructor
            }
            auto newTail = (localBlockIndex->tail.load(std::memory_order_relaxed) + 1) & (localBlockIndex->capacity - 1);
            idxEntry = localBlockIndex->index[newTail];
            if (idxEntry->key.load(std::memory_order_relaxed) == INVALID_BLOCK_BASE ||
                idxEntry->value.load(std::memory_order_relaxed) == nullptr) {
                
                idxEntry->key.store(blockStartIndex, std::memory_order_relaxed);
                localBlockIndex->tail.store(newTail, std::memory_order_release);
                return true;
            }
            
            // No room in the old block index, try to allocate another one!
            if (allocMode == CannotAlloc || !new_block_index()) {
                return false;
            }
            localBlockIndex = blockIndex.load(std::memory_order_relaxed);
            newTail = (localBlockIndex->tail.load(std::memory_order_relaxed) + 1) & (localBlockIndex->capacity - 1);
            idxEntry = localBlockIndex->index[newTail];
            assert(idxEntry->key.load(std::memory_order_relaxed) == INVALID_BLOCK_BASE);
            idxEntry->key.store(blockStartIndex, std::memory_order_relaxed);
            localBlockIndex->tail.store(newTail, std::memory_order_release);
            return true;
        }